

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

container_t * ra_get_container(roaring_array_t *ra,uint16_t x,uint8_t *typecode)

{
  int32_t iVar1;
  undefined1 *in_RDX;
  uint16_t in_SI;
  int32_t *in_RDI;
  int i;
  container_t *local_8;
  
  iVar1 = binarySearch(*(uint16_t **)(in_RDI + 4),*in_RDI,in_SI);
  if (iVar1 < 0) {
    local_8 = (container_t *)0x0;
  }
  else {
    *in_RDX = *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar1);
    local_8 = *(container_t **)(*(long *)(in_RDI + 2) + (long)iVar1 * 8);
  }
  return local_8;
}

Assistant:

container_t *ra_get_container(roaring_array_t *ra, uint16_t x,
                              uint8_t *typecode) {
    int i = binarySearch(ra->keys, (int32_t)ra->size, x);
    if (i < 0) return NULL;
    *typecode = ra->typecodes[i];
    return ra->containers[i];
}